

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void make_transform_image
               (png_store *ps,png_byte colour_type,png_byte bit_depth,uint palette_number,
               int interlace_type,png_const_charp name)

{
  char cVar1;
  jmp_buf *pa_Var2;
  png_infop ppVar3;
  png_uint_16 pVar4;
  ushort uVar5;
  int iVar6;
  png_uint_32 pVar7;
  uint uVar8;
  png_uint_32 y;
  int iVar9;
  png_store *ps_00;
  ulong uVar10;
  ushort uVar11;
  undefined7 in_register_00000011;
  char *name_00;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  undefined4 in_register_00000084;
  ulong uVar15;
  long lVar16;
  png_infop pi;
  uint local_54c;
  int local_548;
  uint local_544;
  int local_540;
  int local_53c;
  jmp_buf *local_538;
  undefined4 local_530 [2];
  char *local_528;
  char *local_520;
  ulong local_518;
  char local_510 [24];
  char copy [64];
  jmp_buf exception__env;
  
  pa_Var2 = pm.this.exception_context.penv;
  pm.this.exception_context.penv = &exception__env;
  iVar6 = _setjmp((__jmp_buf_tag *)pm.this.exception_context.penv);
  if (iVar6 != 0) {
    pm.this.exception_context.caught = 1;
    pm.this.exception_context.penv = pa_Var2;
    store_write_reset(pm.this.exception_context.v.etmp);
    return;
  }
  local_538 = pa_Var2;
  local_540 = (int)CONCAT71(in_register_00000011,bit_depth);
  local_544 = palette_number;
  ps_00 = (png_store *)
          set_store_for_write((png_store *)&pi,
                              (png_infopp)CONCAT44(in_register_00000084,interlace_type),name_00);
  if (ps_00 == (png_store *)0x0) {
    pm.this.exception_context.v.etmp = &pm.this;
    longjmp((__jmp_buf_tag *)pm.this.exception_context.penv,1);
  }
  uVar15 = (ulong)colour_type;
  pVar7 = transform_height((png_const_structp)ps_00,(png_byte)ps,colour_type);
  local_54c = (uint)colour_type;
  local_548 = (int)((ulong)ps & 0xff);
  png_set_IHDR(ps_00,pi,0x80,pVar7,uVar15,(ulong)ps & 0xff,local_544,0,0);
  iVar6 = (int)uVar15;
  local_530[0]._0_1_ = '\0';
  local_530[0]._1_1_ = '\0';
  local_530[0]._2_1_ = '\0';
  local_530[0]._3_1_ = '\0';
  local_528 = make_transform_image::key;
  uVar10 = (ulong)(byte)pm.this.wname[0];
  if (pm.this.wname[0] == '\0') {
    local_518 = 0;
  }
  else {
    uVar14 = 0;
    do {
      uVar12 = uVar14;
      iVar6 = (int)uVar15;
      copy[uVar12] = (char)uVar10;
      if (uVar12 == 0x3f) {
        uVar14 = 0x40;
        break;
      }
      cVar1 = pm.this.wname[uVar12 + 1];
      uVar15 = CONCAT71((int7)(uVar15 >> 8),cVar1);
      iVar6 = (int)uVar15;
      uVar14 = uVar12 + 1;
      uVar10 = uVar15 & 0xffffffff;
    } while (cVar1 != '\0');
    local_518 = 0x3f;
    if (uVar12 < 0x3f) {
      local_518 = uVar14;
    }
  }
  copy[local_518] = '\0';
  local_520 = copy;
  local_510[0] = '\0';
  local_510[1] = '\0';
  local_510[2] = '\0';
  local_510[3] = '\0';
  local_510[4] = '\0';
  local_510[5] = '\0';
  local_510[6] = '\0';
  local_510[7] = '\0';
  local_510[8] = '\0';
  local_510[9] = '\0';
  local_510[10] = '\0';
  local_510[0xb] = '\0';
  local_510[0xc] = '\0';
  local_510[0xd] = '\0';
  local_510[0xe] = '\0';
  local_510[0xf] = '\0';
  local_510[0x10] = '\0';
  local_510[0x11] = '\0';
  local_510[0x12] = '\0';
  local_510[0x13] = '\0';
  local_510[0x14] = '\0';
  local_510[0x15] = '\0';
  local_510[0x16] = '\0';
  local_510[0x17] = '\0';
  png_set_text(ps_00,pi,local_530,1);
  ppVar3 = pi;
  if ((png_byte)ps == '\x03') {
    init_standard_palette
              (ps_00,(png_structp)pi,(png_infop)(ulong)(uint)(1 << (colour_type & 0x1f)),1,iVar6);
  }
  else if (local_540 != 0) {
    lVar16 = 0;
    do {
      uVar8 = randomize_bytes_random_seed_1 << 7;
      randomize_bytes_random_seed_1 =
           randomize_bytes_random_seed_1 << 8 | randomize_bytes_random_seed_0 >> 0x18;
      uVar8 = (uVar8 | randomize_bytes_random_seed_0 >> 0x19) ^ randomize_bytes_random_seed_0 >> 0xc
      ;
      randomize_bytes_random_seed_0 = randomize_bytes_random_seed_0 << 8 | uVar8 & 0xff;
      copy[lVar16] = (char)uVar8;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 10);
    if (((ulong)ps & 2) == 0) {
      pVar4 = random_u16();
      uVar5 = pVar4 & ~(ushort)(-1 << (colour_type & 0x1f));
      copy[8] = (char)uVar5;
      copy[9] = (char)(uVar5 >> 8);
    }
    else {
      pVar4 = random_u16();
      copy[2] = (char)pVar4;
      copy[3] = (char)(pVar4 >> 8);
      if (colour_type == '\b') {
        pVar4 = random_u16();
        uVar5 = copy._2_2_ ^ pVar4;
        copy._0_4_ = copy._0_4_ & 0xffffff;
        copy._4_2_ = pVar4 & 0xff;
        copy._6_2_ = uVar5 & 0xff;
      }
      else {
        copy._4_2_ = pVar4 * 0x101;
        copy._6_2_ = pVar4 * 0x1111;
      }
    }
    png_set_tRNS(ps_00,ppVar3,0,0,copy);
  }
  png_write_info(ps_00,pi);
  uVar10 = png_get_rowbytes(ps_00,pi);
  uVar8 = bit_size((png_const_structp)ps_00,(png_byte)local_548,(png_byte)local_54c);
  if (uVar10 == uVar8 << 4) {
    iVar6 = png_set_interlace_handling(ps_00);
    iVar9 = 1;
    if (local_544 != 0) {
      if (local_544 != 1) {
        pcVar13 = "invalid interlace type";
        goto LAB_0010aeb0;
      }
      iVar9 = 7;
    }
    if (iVar6 == iVar9) {
      if (0 < iVar6) {
        iVar9 = 0;
        local_53c = iVar6;
        do {
          if (pVar7 != 0) {
            y = 0;
            do {
              transform_row((png_const_structp)ps_00,(png_byte *)copy,(png_byte)local_548,
                            (png_byte)local_54c,y);
              pVar4 = random_u16();
              uVar5 = pVar4 & 0xf8;
              if (uVar5 != 0) {
                uVar11 = uVar5 | 0x20;
                if (0x1f < uVar5) {
                  uVar11 = uVar5;
                }
                if (y != 0 || iVar9 != 0) {
                  uVar11 = uVar5;
                }
                png_set_filter(ps_00,0,uVar11);
              }
              png_write_row(ps_00,copy);
              y = y + 1;
            } while (pVar7 != y);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != local_53c);
      }
      copy[0] = '\0';
      copy[1] = '\0';
      copy[2] = '\0';
      copy[3] = '\0';
      copy._8_8_ = make_transform_image::key_1;
      copy._16_8_ = make_transform_image::comment;
      copy[0x18] = '\x03';
      copy[0x19] = '\0';
      copy[0x1a] = '\0';
      copy[0x1b] = '\0';
      copy[0x1c] = '\0';
      copy[0x1d] = '\0';
      copy[0x1e] = '\0';
      copy[0x1f] = '\0';
      copy[0x20] = '\0';
      copy[0x21] = '\0';
      copy[0x22] = '\0';
      copy[0x23] = '\0';
      copy[0x24] = '\0';
      copy[0x25] = '\0';
      copy[0x26] = '\0';
      copy[0x27] = '\0';
      copy[0x28] = '\0';
      copy[0x29] = '\0';
      copy[0x2a] = '\0';
      copy[0x2b] = '\0';
      copy[0x2c] = '\0';
      copy[0x2d] = '\0';
      copy[0x2e] = '\0';
      copy[0x2f] = '\0';
      copy[0x30] = '\0';
      copy[0x31] = '\0';
      copy[0x32] = '\0';
      copy[0x33] = '\0';
      copy[0x34] = '\0';
      copy[0x35] = '\0';
      copy[0x36] = '\0';
      copy[0x37] = '\0';
      png_set_text(ps_00,pi,copy,1);
      png_write_end(ps_00);
      store_storefile((png_store *)
                      (ulong)(local_544 * 0x2000 + local_540 * 0x100 + local_548 + local_54c * 8),
                      (png_uint_32)pi);
      store_write_reset(&pm.this);
      pm.this.exception_context.penv = local_538;
      pm.this.exception_context.caught = 0;
      return;
    }
    pcVar13 = "write: png_set_interlace_handling failed";
  }
  else {
    pcVar13 = "transform row size incorrect";
  }
LAB_0010aeb0:
  png_error(ps_00,pcVar13);
}

Assistant:

static void
make_transform_image(png_store* const ps, png_byte const colour_type,
    png_byte const bit_depth, unsigned int palette_number,
    int interlace_type, png_const_charp name)
{
   context(ps, fault);

   check_interlace_type(interlace_type);

   Try
   {
      png_infop pi;
      png_structp pp = set_store_for_write(ps, &pi, name);
      png_uint_32 h, w;

      /* In the event of a problem return control to the Catch statement below
       * to do the clean up - it is not possible to 'return' directly from a Try
       * block.
       */
      if (pp == NULL)
         Throw ps;

      w = transform_width(pp, colour_type, bit_depth);
      h = transform_height(pp, colour_type, bit_depth);

      png_set_IHDR(pp, pi, w, h, bit_depth, colour_type, interlace_type,
         PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

#ifdef PNG_TEXT_SUPPORTED
#  if defined(PNG_READ_zTXt_SUPPORTED) && defined(PNG_WRITE_zTXt_SUPPORTED)
#     define TEXT_COMPRESSION PNG_TEXT_COMPRESSION_zTXt
#  else
#     define TEXT_COMPRESSION PNG_TEXT_COMPRESSION_NONE
#  endif
      {
         static char key[] = "image name"; /* must be writeable */
         size_t pos;
         png_text text;
         char copy[FILE_NAME_SIZE];

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         /* Yuck: the text must be writable! */
         pos = safecat(copy, sizeof copy, 0, ps->wname);
         text.text = copy;
         text.text_length = pos;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      if (colour_type == 3) /* palette */
         init_standard_palette(ps, pp, pi, 1U << bit_depth, 1/*do tRNS*/);

#     ifdef PNG_WRITE_tRNS_SUPPORTED
         else if (palette_number)
            set_random_tRNS(pp, pi, colour_type, bit_depth);
#     endif

      png_write_info(pp, pi);

      if (png_get_rowbytes(pp, pi) !=
          transform_rowsize(pp, colour_type, bit_depth))
         png_error(pp, "transform row size incorrect");

      else
      {
         /* Somewhat confusingly this must be called *after* png_write_info
          * because if it is called before, the information in *pp has not been
          * updated to reflect the interlaced image.
          */
         int npasses = set_write_interlace_handling(pp, interlace_type);
         int pass;

         if (npasses != npasses_from_interlace_type(pp, interlace_type))
            png_error(pp, "write: png_set_interlace_handling failed");

         for (pass=0; pass<npasses; ++pass)
         {
            png_uint_32 y;

            /* do_own_interlace is a pre-defined boolean (a #define) which is
             * set if we have to work out the interlaced rows here.
             */
            for (y=0; y<h; ++y)
            {
               png_byte buffer[TRANSFORM_ROWMAX];

               transform_row(pp, buffer, colour_type, bit_depth, y);

#              if do_own_interlace
                  /* If do_own_interlace *and* the image is interlaced we need a
                   * reduced interlace row; this may be reduced to empty.
                   */
                  if (interlace_type == PNG_INTERLACE_ADAM7)
                  {
                     /* The row must not be written if it doesn't exist, notice
                      * that there are two conditions here, either the row isn't
                      * ever in the pass or the row would be but isn't wide
                      * enough to contribute any pixels.  In fact the wPass test
                      * can be used to skip the whole y loop in this case.
                      */
                     if (PNG_ROW_IN_INTERLACE_PASS(y, pass) &&
                         PNG_PASS_COLS(w, pass) > 0)
                        interlace_row(buffer, buffer,
                              bit_size(pp, colour_type, bit_depth), w, pass,
                              0/*data always bigendian*/);
                     else
                        continue;
                  }
#              endif /* do_own_interlace */

               choose_random_filter(pp, pass == 0 && y == 0);
               png_write_row(pp, buffer);
            }
         }
      }

#ifdef PNG_TEXT_SUPPORTED
      {
         static char key[] = "end marker";
         static char comment[] = "end";
         png_text text;

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         text.text = comment;
         text.text_length = (sizeof comment)-1;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      png_write_end(pp, pi);

      /* And store this under the appropriate id, then clean up. */
      store_storefile(ps, FILEID(colour_type, bit_depth, palette_number,
         interlace_type, 0, 0, 0));

      store_write_reset(ps);
   }

   Catch(fault)
   {
      /* Use the png_store returned by the exception. This may help the compiler
       * because 'ps' is not used in this branch of the setjmp.  Note that fault
       * and ps will always be the same value.
       */
      store_write_reset(fault);
   }
}